

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

double FrictionToMoveFactor(double friction)

{
  double dVar1;
  double dVar2;
  
  if (0.90625 <= friction) {
    dVar1 = ((65682.0 - friction * 65536.0) * 1024.0) / 4352.0 + 568.0;
  }
  else {
    dVar1 = (friction * 65536.0 + -56116.0) * 10.0 * 0.0078125;
  }
  dVar2 = 0.00048828125;
  if (0.00048828125 <= dVar1 * 1.52587890625e-05) {
    dVar2 = dVar1 * 1.52587890625e-05;
  }
  return dVar2;
}

Assistant:

double FrictionToMoveFactor(double friction)
{
	double movefactor;

	// [RH] Twiddled these values so that velocity on ice (with
	//		friction 0xf900) is the same as in Heretic/Hexen.
	if (friction >= ORIG_FRICTION)	// ice
									//movefactor = ((0x10092 - friction)*(0x70))/0x158;
		movefactor = (((0x10092 - friction * 65536) * 1024) / 4352 + 568) / 65536.;
	else
		movefactor = (((friction*65536. - 0xDB34)*(0xA)) / 0x80) / 65536.;

	// killough 8/28/98: prevent odd situations
	if (movefactor < 1 / 2048.)
		movefactor = 1 / 2048.;

	return movefactor;
}